

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astLambdaNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t flags,
          sysbvm_tuple_t arguments,sysbvm_tuple_t resultType,sysbvm_tuple_t body)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).astLambdaNodeType,0xc);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[2].header.field_0.typePointer = flags;
  psVar1[2].field_1.pointers[0] = arguments;
  psVar1[3].header.field_0.typePointer = resultType;
  psVar1[3].header.identityHashAndFlags = (int)body;
  psVar1[3].header.objectSize = (int)(body >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astLambdaNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t flags, sysbvm_tuple_t arguments, sysbvm_tuple_t resultType, sysbvm_tuple_t body)
{
    sysbvm_astLambdaNode_t *result = (sysbvm_astLambdaNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astLambdaNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astLambdaNode_t));
    result->super.sourcePosition = sourcePosition;
    result->flags = flags;
    result->arguments = arguments;
    result->resultType = resultType;
    result->body = body;
    return (sysbvm_tuple_t)result;
}